

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O0

pipe * __thiscall blc::tools::pipe::operator=(pipe *this,pipe *other)

{
  bool bVar1;
  string *psVar2;
  mutex *pmVar3;
  pipe *in_RSI;
  pipe *in_RDI;
  shared_ptr<bool> *in_stack_ffffffffffffffe0;
  
  psVar2 = getIn_abi_cxx11_(in_RSI);
  in_RDI->_in = psVar2;
  psVar2 = getOut_abi_cxx11_(in_RSI);
  in_RDI->_out = psVar2;
  pmVar3 = getInMut(in_RSI);
  in_RDI->_inMut = pmVar3;
  pmVar3 = getOutMut(in_RSI);
  in_RDI->_outMut = pmVar3;
  bVar1 = getState(in_RSI);
  in_RDI->_master = bVar1;
  bVar1 = getBlock(in_RSI);
  in_RDI->_block = bVar1;
  getClosed(in_RDI);
  std::shared_ptr<bool>::operator=(in_stack_ffffffffffffffe0,(shared_ptr<bool> *)in_RDI);
  std::shared_ptr<bool>::~shared_ptr((shared_ptr<bool> *)0x11be52);
  return in_RDI;
}

Assistant:

blc::tools::pipe &blc::tools::pipe::operator=(const pipe &other) {
	this->_in = const_cast<blc::tools::pipe &>(other).getIn();
	this->_out = const_cast<blc::tools::pipe &>(other).getOut();
	this->_inMut = const_cast<blc::tools::pipe &>(other).getInMut();
	this->_outMut = const_cast<blc::tools::pipe &>(other).getOutMut();
	this->_master = const_cast<blc::tools::pipe &>(other).getState();
	this->_block = const_cast<blc::tools::pipe &>(other).getBlock();
	this->_closed = const_cast<blc::tools::pipe &>(other).getClosed();
	return (*this);
}